

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O0

void __thiscall
icu_63::MessagePattern::MessagePattern
          (MessagePattern *this,UnicodeString *pattern,UParseError *parseError,UErrorCode *errorCode
          )

{
  int iVar1;
  UErrorCode *errorCode_local;
  UParseError *parseError_local;
  UnicodeString *pattern_local;
  MessagePattern *this_local;
  
  UObject::UObject(&this->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__MessagePattern_004a1e60;
  this->aposMode = UMSGPAT_APOS_DOUBLE_OPTIONAL;
  UnicodeString::UnicodeString(&this->msg);
  this->partsList = (MessagePatternPartsList *)0x0;
  this->parts = (Part *)0x0;
  this->partsLength = 0;
  this->numericValuesList = (MessagePatternDoubleList *)0x0;
  this->numericValues = (double *)0x0;
  this->numericValuesLength = 0;
  this->hasArgNames = '\0';
  this->hasArgNumbers = '\0';
  this->needsAutoQuoting = '\0';
  iVar1 = init(this,(EVP_PKEY_CTX *)errorCode);
  if ((char)iVar1 != '\0') {
    parse(this,pattern,parseError,errorCode);
  }
  return;
}

Assistant:

MessagePattern::MessagePattern(const UnicodeString &pattern, UParseError *parseError, UErrorCode &errorCode)
        : aposMode(UCONFIG_MSGPAT_DEFAULT_APOSTROPHE_MODE),
          partsList(NULL), parts(NULL), partsLength(0),
          numericValuesList(NULL), numericValues(NULL), numericValuesLength(0),
          hasArgNames(FALSE), hasArgNumbers(FALSE), needsAutoQuoting(FALSE) {
    if(init(errorCode)) {
        parse(pattern, parseError, errorCode);
    }
}